

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

char * ptls_jsonescape(char *buf,char *unsafe_str,size_t len)

{
  byte bVar1;
  size_t sVar2;
  uint8_t *src;
  char *dst;
  
  if (len != 0) {
    sVar2 = 0;
    do {
      bVar1 = unsafe_str[sVar2];
      if (0x21 < bVar1) {
        if (bVar1 == 0x5c) {
          ((byte *)buf)[0] = 0x5c;
          ((byte *)buf)[1] = 0x5c;
        }
        else if (bVar1 == 0x2f) {
          ((byte *)buf)[0] = 0x5c;
          ((byte *)buf)[1] = 0x2f;
        }
        else {
          if (bVar1 != 0x22) goto switchD_001186da_caseD_b;
          ((byte *)buf)[0] = 0x5c;
          ((byte *)buf)[1] = 0x22;
        }
        goto LAB_00118725;
      }
      switch(bVar1) {
      case 8:
        ((byte *)buf)[0] = 0x5c;
        ((byte *)buf)[1] = 0x62;
        break;
      case 9:
        ((byte *)buf)[0] = 0x5c;
        ((byte *)buf)[1] = 0x74;
        break;
      case 10:
        ((byte *)buf)[0] = 0x5c;
        ((byte *)buf)[1] = 0x6e;
        break;
      default:
switchD_001186da_caseD_b:
        if (bVar1 < 0x20 || bVar1 == 0x7f) {
          ((byte *)buf)[0] = 0x5c;
          ((byte *)buf)[1] = 0x75;
          ((byte *)buf)[2] = 0x30;
          ((byte *)buf)[3] = 0x30;
          bVar1 = unsafe_str[sVar2];
          ((byte *)buf)[4] = "0123456789abcdef"[bVar1 >> 4];
          ((byte *)buf)[5] = "0123456789abcdef"[bVar1 & 0xf];
          buf = (char *)((byte *)buf + 6);
        }
        else {
          *buf = bVar1;
          buf = (char *)((byte *)buf + 1);
        }
        goto LAB_00118729;
      case 0xc:
        ((byte *)buf)[0] = 0x5c;
        ((byte *)buf)[1] = 0x66;
        break;
      case 0xd:
        ((byte *)buf)[0] = 0x5c;
        ((byte *)buf)[1] = 0x72;
      }
LAB_00118725:
      buf = (char *)((byte *)buf + 2);
LAB_00118729:
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  *buf = 0;
  return buf;
}

Assistant:

char *ptls_jsonescape(char *buf, const char *unsafe_str, size_t len)
{
    char *dst = buf;
    const uint8_t *src = (const uint8_t *)unsafe_str, *end = src + len;

    for (; src != end; ++src) {
        switch (*src) {
#define MAP(ch, escaped)                                                                                                           \
    case ch:                                                                                                                       \
        memcpy(dst, (escaped), sizeof(escaped) - 1);                                                                               \
        dst += sizeof(escaped) - 1;                                                                                                \
        break
            MAP('"', "\\\"");
            MAP('\\', "\\\\");
            MAP('/', "\\/");
            MAP('\b', "\\b");
            MAP('\f', "\\f");
            MAP('\n', "\\n");
            MAP('\r', "\\r");
            MAP('\t', "\\t");
#undef MAP
        default:
            if (*src < 0x20 || *src == 0x7f) {
                *dst++ = '\\';
                *dst++ = 'u';
                *dst++ = '0';
                *dst++ = '0';
                dst = byte_to_hex(dst, *src);
            } else {
                *dst++ = *src;
            }
            break;
        }
    }
    *dst = '\0';

    return dst;
}